

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.c
# Opt level: O3

void gc_acc_twist_tf_ref_to_tgt(gc_pose *x,gc_acc_twist *xdd,gc_acc_twist *r)

{
  vector3 v_rxw;
  vector3 rxw;
  
  if (x == (gc_pose *)0x0) {
    __assert_fail("x",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,0x127,
                  "void gc_acc_twist_tf_ref_to_tgt(const struct gc_pose *, const struct gc_acc_twist *, struct gc_acc_twist *)"
                 );
  }
  if (xdd == (gc_acc_twist *)0x0) {
    __assert_fail("xdd",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,0x128,
                  "void gc_acc_twist_tf_ref_to_tgt(const struct gc_pose *, const struct gc_acc_twist *, struct gc_acc_twist *)"
                 );
  }
  if (r == (gc_acc_twist *)0x0) {
    __assert_fail("r",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,0x129,
                  "void gc_acc_twist_tf_ref_to_tgt(const struct gc_pose *, const struct gc_acc_twist *, struct gc_acc_twist *)"
                 );
  }
  if (xdd != r) {
    la_dcross_o((double *)x->translation,1,(double *)xdd->angular_acceleration,1,(double *)&rxw,1);
    la_daxpy_oe(3,-1.0,(double *)&rxw,1,(double *)xdd->linear_acceleration,1,(double *)&v_rxw,1);
    la_dgemv_nos(3,3,(double *)x->rotation,3,(double *)xdd->angular_acceleration,1,
                 (double *)r->angular_acceleration,1);
    la_dgemv_nos(3,3,(double *)x->rotation,3,(double *)&v_rxw,1,(double *)r->linear_acceleration,1);
    return;
  }
  __assert_fail("xdd != r",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                ,0x12a,
                "void gc_acc_twist_tf_ref_to_tgt(const struct gc_pose *, const struct gc_acc_twist *, struct gc_acc_twist *)"
               );
}

Assistant:

void gc_acc_twist_tf_ref_to_tgt(
        const struct gc_pose *x,
        const struct gc_acc_twist *xdd,
        struct gc_acc_twist *r)
{
    assert(x);
    assert(xdd);
    assert(r);
    assert(xdd != r);

    // r x w
    struct vector3 rxw;
    la_dcross_o((double *)x->translation, 1,
            (double *)xdd->angular_acceleration, 1,
            (double *)&rxw, 1);

    // v - r x w
    struct vector3 v_rxw;
    la_daxpy_oe(3,
            -1.0, (double *)&rxw, 1,
            (double *)xdd->linear_acceleration, 1,
            (double *)&v_rxw, 1);

    // v' = E(v - r x w)
    la_dgemv_nos(3, 3,
            (double *)x->rotation, 3,
            (double *)xdd->angular_acceleration, 1,
            (double *)r->angular_acceleration, 1);

    // w' = E w
    la_dgemv_nos(3, 3,
            (double *)x->rotation, 3,
            (double *)&v_rxw, 1,
            (double *)r->linear_acceleration, 1);
}